

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O3

void __thiscall apngasm_cli::Options::Options(Options *this,int argc,char **argv)

{
  options_description *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  variables_map *pvVar4;
  Options *this_01;
  char *pcVar5;
  _Node *p_Var6;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar7;
  typed_value<int,_char> *ptVar8;
  char *pcVar9;
  typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
  *ptVar10;
  _List_node_base *p_Var11;
  uint uVar12;
  size_type __dnew_1;
  OPTGROUPS opts_packer;
  parsed_options parsed;
  command_line_parser parser;
  options_description all_opts;
  options_description hidden_opts;
  positional_options_description positional_opts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  _List_base<boost::program_options::options_description,_std::allocator<boost::program_options::options_description>_>
  local_2a8;
  variables_map *local_290;
  Options *local_288;
  options_description local_280;
  char **local_200;
  undefined8 local_1f8;
  int local_1ec;
  undefined1 local_1e8 [64];
  _Bit_type *local_1a8;
  uint local_1a0;
  _Bit_type *local_198;
  uint local_190;
  _Bit_pointer local_188;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_180;
  options_description local_168;
  options_description local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  long *local_50;
  long local_40 [2];
  
  (this->option_vec).
  super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->option_vec).
  super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->option_vec).
  super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_288 = this;
  boost::program_options::variables_map::variables_map(&this->vm);
  uVar3 = (uint)boost::program_options::options_description::m_default_line_length;
  this_00 = &this->visible_opts;
  uVar12 = (uint)boost::program_options::options_description::m_default_line_length >> 1;
  local_290 = &this->vm;
  boost::program_options::options_description::options_description
            (this_00,(uint)boost::program_options::options_description::m_default_line_length,uVar12
            );
  this->overwrite_mode = 0;
  local_2a8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_2a8;
  local_2a8._M_impl._M_node._M_size = 0;
  local_2a8._M_impl._M_node.super__List_node_base._M_prev =
       local_2a8._M_impl._M_node.super__List_node_base._M_next;
  boost::program_options::positional_options_description::positional_options_description
            ((positional_options_description *)&local_68);
  local_280.m_caption._M_dataplus._M_p = (pointer)0x13;
  local_1e8._0_8_ = local_1e8 + 0x10;
  local_1e8._0_8_ =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                  (size_type *)&local_280,0);
  local_1e8._16_8_ = local_280.m_caption._M_dataplus._M_p;
  builtin_strncpy((char *)local_1e8._0_8_,"Information Options",0x13);
  local_1e8._8_8_ = local_280.m_caption._M_dataplus._M_p;
  *(local_1e8._0_8_ + local_280.m_caption._M_dataplus._M_p) = '\0';
  boost::program_options::options_description::options_description
            (&local_168,(string *)local_1e8,uVar3,uVar12);
  if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
    operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
  }
  local_1e8._0_8_ = boost::program_options::options_description::add_options();
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (local_1e8,"version,v");
  boost::program_options::options_description_easy_init::operator()(pcVar5,"help,h");
  local_200 = argv;
  p_Var6 = std::__cxx11::
           list<boost::program_options::options_description,std::allocator<boost::program_options::options_description>>
           ::_M_create_node<boost::program_options::options_description_const&>
                     ((list<boost::program_options::options_description,std::allocator<boost::program_options::options_description>>
                       *)&local_2a8,&local_168);
  std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
  local_2a8._M_impl._M_node._M_size = local_2a8._M_impl._M_node._M_size + 1;
  boost::program_options::options_description::add(this_00);
  paVar1 = &local_280.m_caption.field_2;
  local_280.m_caption.field_2._M_allocated_capacity = 0x74704f206e69614d;
  local_280.m_caption.field_2._8_4_ = 0x736e6f69;
  local_280.m_caption._M_string_length = 0xc;
  local_280.m_caption.field_2._M_local_buf[0xc] = '\0';
  local_280.m_caption._M_dataplus._M_p = (pointer)paVar1;
  boost::program_options::options_description::options_description
            ((options_description *)local_1e8,(string *)&local_280,uVar3,uVar12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280.m_caption._M_dataplus._M_p != paVar1) {
    operator_delete(local_280.m_caption._M_dataplus._M_p,
                    local_280.m_caption.field_2._M_allocated_capacity + 1);
  }
  local_1f8 = boost::program_options::options_description::add_options();
  ptVar7 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_280.m_caption.field_2._M_allocated_capacity._0_4_ = 0x303031;
  local_280.m_caption._M_string_length = 3;
  local_280.m_caption._M_dataplus._M_p = (pointer)paVar1;
  ptVar7 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar7,&local_280.m_caption);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&local_1f8,(value_semantic *)"delay,d",(char *)ptVar7);
  ptVar8 = boost::program_options::value<int>((int *)0x0);
  local_1ec = 0;
  ptVar8 = boost::program_options::typed_value<int,_char>::default_value(ptVar8,&local_1ec);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"loops,l",(char *)ptVar8);
  ptVar7 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"file,f",(char *)ptVar7);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,"skip,s");
  ptVar7 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"disassemble,D",(char *)ptVar7);
  ptVar7 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"output,o",(char *)ptVar7);
  ptVar7 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  paVar2 = &local_e8.m_caption.field_2;
  local_e8.m_caption.field_2._M_allocated_capacity._0_6_ = 0x74616d696e61;
  local_e8.m_caption.field_2._M_allocated_capacity._6_2_ = 0x6f69;
  local_e8.m_caption.field_2._8_6_ = 0x6e6f736a2e6e;
  local_e8.m_caption._M_string_length = 0xe;
  local_e8.m_caption.field_2._M_local_buf[0xe] = '\0';
  local_e8.m_caption._M_dataplus._M_p = (pointer)paVar2;
  ptVar7 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::implicit_value(ptVar7,&local_e8.m_caption);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"json,j",(char *)ptVar7);
  ptVar7 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  paVar1 = &local_2c8.field_2;
  local_2c8.field_2._M_allocated_capacity._0_5_ = 0x616d696e61;
  local_2c8.field_2._M_local_buf[5] = 't';
  local_2c8.field_2._M_allocated_capacity._6_2_ = 0x6f69;
  local_2c8.field_2._8_5_ = 0x6c6d782e6e;
  local_2c8._M_string_length = 0xd;
  local_2c8.field_2._M_local_buf[0xd] = '\0';
  local_2c8._M_dataplus._M_p = (pointer)paVar1;
  ptVar7 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::implicit_value(ptVar7,&local_2c8);
  boost::program_options::options_description_easy_init::operator()
            (pcVar5,(value_semantic *)"xml,x",(char *)ptVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2c8._M_dataplus._M_p,
                    CONCAT26(local_2c8.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_2c8.field_2._M_local_buf[5],
                                      local_2c8.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.m_caption._M_dataplus._M_p != paVar2) {
    operator_delete(local_e8.m_caption._M_dataplus._M_p,
                    CONCAT26(local_e8.m_caption.field_2._M_allocated_capacity._6_2_,
                             local_e8.m_caption.field_2._M_allocated_capacity._0_6_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280.m_caption._M_dataplus._M_p != &local_280.m_caption.field_2) {
    operator_delete(local_280.m_caption._M_dataplus._M_p,
                    local_280.m_caption.field_2._M_allocated_capacity + 1);
  }
  p_Var6 = std::__cxx11::
           list<boost::program_options::options_description,std::allocator<boost::program_options::options_description>>
           ::_M_create_node<boost::program_options::options_description_const&>
                     ((list<boost::program_options::options_description,std::allocator<boost::program_options::options_description>>
                       *)&local_2a8,(options_description *)local_1e8);
  std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
  local_2a8._M_impl._M_node._M_size = local_2a8._M_impl._M_node._M_size + 1;
  boost::program_options::options_description::add(this_00);
  local_2c8._M_dataplus._M_p = (pointer)0x11;
  local_e8.m_caption._M_dataplus._M_p = (pointer)paVar2;
  local_e8.m_caption._M_dataplus._M_p =
       std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                 (&local_e8.m_caption,(size_type *)&local_2c8,0);
  local_e8.m_caption.field_2._M_allocated_capacity._0_6_ = SUB86(local_2c8._M_dataplus._M_p,0);
  local_e8.m_caption.field_2._M_allocated_capacity._6_2_ =
       (undefined2)((ulong)local_2c8._M_dataplus._M_p >> 0x30);
  builtin_strncpy(local_e8.m_caption._M_dataplus._M_p,"Overwrite Options",0x11);
  local_e8.m_caption._M_string_length = (size_type)local_2c8._M_dataplus._M_p;
  local_e8.m_caption._M_dataplus._M_p[local_2c8._M_dataplus._M_p] = '\0';
  boost::program_options::options_description::options_description
            (&local_280,(string *)&local_e8,uVar3,uVar12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.m_caption._M_dataplus._M_p != paVar2) {
    operator_delete(local_e8.m_caption._M_dataplus._M_p,
                    CONCAT26(local_e8.m_caption.field_2._M_allocated_capacity._6_2_,
                             local_e8.m_caption.field_2._M_allocated_capacity._0_6_) + 1);
  }
  local_e8.m_caption._M_dataplus._M_p =
       (pointer)boost::program_options::options_description::add_options();
  pcVar5 = (char *)operator_new(8);
  *(undefined ***)pcVar5 = &PTR_name_abi_cxx11__0014c100;
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&local_e8,(value_semantic *)"nooverwrite,n",pcVar5);
  pcVar9 = (char *)operator_new(8);
  *(undefined ***)pcVar9 = &PTR_name_abi_cxx11__0014c100;
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"interactive,i",pcVar9);
  pcVar9 = (char *)operator_new(8);
  *(undefined ***)pcVar9 = &PTR_name_abi_cxx11__0014c100;
  boost::program_options::options_description_easy_init::operator()
            (pcVar5,(value_semantic *)"force,F",pcVar9);
  p_Var6 = std::__cxx11::
           list<boost::program_options::options_description,std::allocator<boost::program_options::options_description>>
           ::_M_create_node<boost::program_options::options_description_const&>
                     ((list<boost::program_options::options_description,std::allocator<boost::program_options::options_description>>
                       *)&local_2a8,&local_280);
  std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
  local_2a8._M_impl._M_node._M_size = local_2a8._M_impl._M_node._M_size + 1;
  boost::program_options::options_description::add(this_00);
  local_2c8.field_2._M_allocated_capacity._0_5_ = 0x6564646948;
  local_2c8.field_2._M_local_buf[5] = 'n';
  local_2c8.field_2._M_allocated_capacity._6_2_ = 0x6f20;
  local_2c8.field_2._8_5_ = 0x6e6f697470;
  local_2c8.field_2._M_local_buf[0xd] = 's';
  local_2c8._M_string_length = 0xe;
  local_2c8.field_2._M_local_buf[0xe] = '\0';
  local_2c8._M_dataplus._M_p = (pointer)paVar1;
  boost::program_options::options_description::options_description
            (&local_e8,(string *)&local_2c8,uVar3,uVar12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2c8._M_dataplus._M_p,
                    CONCAT26(local_2c8.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_2c8.field_2._M_local_buf[5],
                                      local_2c8.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  local_2c8._M_dataplus._M_p = (pointer)boost::program_options::options_description::add_options();
  ptVar10 = boost::program_options::
            value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)0x0);
  boost::program_options::options_description_easy_init::operator()
            ((char *)&local_2c8,(value_semantic *)"files",(char *)ptVar10);
  p_Var6 = std::__cxx11::
           list<boost::program_options::options_description,std::allocator<boost::program_options::options_description>>
           ::_M_create_node<boost::program_options::options_description_const&>
                     ((list<boost::program_options::options_description,std::allocator<boost::program_options::options_description>>
                       *)&local_2a8,&local_e8);
  std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
  local_2a8._M_impl._M_node._M_size = local_2a8._M_impl._M_node._M_size + 1;
  boost::program_options::positional_options_description::add((char *)&local_68,0x13a459);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(&local_e8.groups);
  if (local_e8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_e8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_e8.belong_to_group.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_end_of_storage -
                    (long)local_e8.belong_to_group.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_e8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_e8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_e8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_e8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_e8.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(&local_e8.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.m_caption._M_dataplus._M_p != paVar2) {
    operator_delete(local_e8.m_caption._M_dataplus._M_p,
                    CONCAT26(local_e8.m_caption.field_2._M_allocated_capacity._6_2_,
                             local_e8.m_caption.field_2._M_allocated_capacity._0_6_) + 1);
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(&local_280.groups);
  if (local_280.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_280.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_280.belong_to_group.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_end_of_storage -
                    (long)local_280.belong_to_group.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_280.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_280.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_280.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_280.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_280.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(&local_280.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280.m_caption._M_dataplus._M_p != &local_280.m_caption.field_2) {
    operator_delete(local_280.m_caption._M_dataplus._M_p,
                    local_280.m_caption.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(&local_180);
  if (local_1a8 != (_Bit_type *)0x0) {
    operator_delete(local_1a8,(long)local_188 - (long)local_1a8);
    local_1a8 = (_Bit_type *)0x0;
    local_1a0 = 0;
    local_198 = (_Bit_type *)0x0;
    local_190 = 0;
    local_188 = (_Bit_pointer)0x0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector((vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
             *)(local_1e8 + 0x28));
  if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
    operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(&local_168.groups);
  if (local_168.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_168.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_168.belong_to_group.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_end_of_storage -
                    (long)local_168.belong_to_group.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_168.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_168.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_168.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_168.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_168.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(&local_168.m_options);
  paVar1 = &local_168.m_caption.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168.m_caption._M_dataplus._M_p != paVar1) {
    operator_delete(local_168.m_caption._M_dataplus._M_p,
                    local_168.m_caption.field_2._M_allocated_capacity + 1);
  }
  boost::program_options::options_description::options_description(&local_168,uVar3,uVar12);
  p_Var11 = (_List_node_base *)&local_2a8;
  while (p_Var11 = (((_List_impl *)&p_Var11->_M_next)->_M_node).super__List_node_base._M_next,
        p_Var11 != (_List_node_base *)&local_2a8) {
    boost::program_options::options_description::add(&local_168);
  }
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)local_1e8,argc,local_200);
  this_01 = local_288;
  pvVar4 = local_290;
  boost::program_options::detail::cmdline::set_options_description((options_description *)local_1e8)
  ;
  local_180.
  super__Vector_base<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&local_168;
  boost::program_options::detail::cmdline::set_positional_options
            ((positional_options_description *)local_1e8);
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_parsed_options<char> *)&local_280,(basic_command_line_parser<char> *)local_1e8);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::operator=(&this_01->option_vec,
              (vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
               *)&local_280);
  boost::program_options::store((basic_parsed_options *)&local_280,pvVar4,false);
  boost::program_options::notify(pvVar4);
  setOverwriteMode(this_01);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)&local_280);
  boost::
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~function1((function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
                *)&local_198);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1((function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)(local_1e8 + 0x30));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1e8);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(&local_168.groups);
  if (local_168.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_168.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_168.belong_to_group.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_end_of_storage -
                    (long)local_168.belong_to_group.super__Bvector_base<std::allocator<bool>_>.
                          _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_168.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_168.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    local_168.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_168.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_168.belong_to_group.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(&local_168.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168.m_caption._M_dataplus._M_p != paVar1) {
    operator_delete(local_168.m_caption._M_dataplus._M_p,
                    local_168.m_caption.field_2._M_allocated_capacity + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  std::__cxx11::
  _List_base<boost::program_options::options_description,_std::allocator<boost::program_options::options_description>_>
  ::_M_clear(&local_2a8);
  return;
}

Assistant:

Options::Options(int argc, char **argv)
    : overwrite_mode(OVERWRITE_INTERACTIVE) {
  namespace po = boost::program_options;

  typedef std::list<po::options_description> OPTGROUPS;
  OPTGROUPS opts_packer;
  po::positional_options_description positional_opts;
  processOptions(opts_packer, visible_opts, positional_opts);

  // pack all options & parse it
  po::options_description all_opts;
  {
    OPTGROUPS::const_iterator it = opts_packer.begin();
    for (; it != opts_packer.end(); ++it) {
      all_opts.add(*it);
    }
  }
  po::command_line_parser parser(argc, argv);
  parser.options(all_opts);
  parser.positional(positional_opts);
  po::parsed_options parsed = parser.run();
  option_vec = parsed.options;
  po::store(parsed, vm);
  po::notify(vm);

  setOverwriteMode();
}